

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O0

int strStr(string *haystack,string *needle)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  int local_40;
  int local_3c;
  int i_2;
  int hash_code;
  int i_1;
  int target_code;
  int i;
  int power;
  int haystack_size;
  int needle_size;
  string *needle_local;
  string *haystack_local;
  
  _haystack_size = needle;
  needle_local = haystack;
  power = std::__cxx11::string::length();
  i = std::__cxx11::string::length();
  if (i == 0) {
    if (power == 0) {
      haystack_local._4_4_ = 0;
    }
    else {
      haystack_local._4_4_ = -1;
    }
  }
  else if (i < power) {
    haystack_local._4_4_ = -1;
  }
  else {
    target_code = 1;
    for (i_1 = 0; i_1 < power; i_1 = i_1 + 1) {
      target_code = (target_code * 0x1f) % 1000000;
    }
    hash_code = 0;
    for (i_2 = 0; i_2 < power; i_2 = i_2 + 1) {
      iVar2 = hash_code * 0x1f;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)needle);
      hash_code = (iVar2 + *pcVar3) % 1000000;
    }
    local_3c = 0;
    for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
      iVar2 = local_3c * 0x1f;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)haystack);
      iVar2 = (iVar2 + *pcVar3) % 1000000;
      local_3c = iVar2;
      if (power + -1 <= local_40) {
        if (power <= local_40) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)haystack);
          local_3c = iVar2 - (*pcVar3 * target_code) % 1000000;
          if (local_3c < 0) {
            local_3c = local_3c + 1000000;
          }
        }
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40);
        poVar4 = std::operator<<(poVar4," hash_code: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3c);
        poVar4 = std::operator<<(poVar4," target_code: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,hash_code);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        if (local_3c == hash_code) {
          std::__cxx11::string::substr((ulong)local_60,(ulong)haystack);
          _Var1 = std::operator==(local_60,needle);
          std::__cxx11::string::~string((string *)local_60);
          if (_Var1) {
            return (local_40 - power) + 1;
          }
        }
      }
    }
    haystack_local._4_4_ = -1;
  }
  return haystack_local._4_4_;
}

Assistant:

int strStr(std::string haystack, std::string needle) 
{
    int needle_size = needle.length();
    int haystack_size = haystack.length();
    if(haystack_size == 0 )
    {
        if (needle_size ==0)
        {
            return 0;
        }
        else 
        {
            return -1;
        }
    }
    else if(haystack_size<needle_size)
    {
        return -1;
    }
    // using Rabin-Karp algorithm
    static const int kBase = 1000000;
    static const int kHashNum = 31;
    int power = 1.0;
    for(int i = 0; i < needle_size;++i)
    {
        power = (power*kHashNum)%kBase;
    }

    int target_code = 0;
    for(int i = 0; i<needle_size;++i)
    {
        target_code = (target_code*kHashNum+needle[i])%kBase;
    }

    int hash_code = 0;
    for(int i = 0; i<haystack_size;++i)
    {
        // abc+d
        hash_code = (hash_code*kHashNum+haystack[i])%kBase;
        if(i<needle_size-1)
        {
            continue;
        }
        // abcd-a
        if(i>=needle_size)
        {
            hash_code = hash_code -(haystack[i-needle_size]*power)%kBase;
            if(hash_code<0)
            {
                hash_code+=kBase;
            }
        }
        std::cout<<i<<" hash_code: "<< hash_code
                 <<" target_code: "<< target_code <<std::endl;
        // double check the std::string
        if(hash_code==target_code)
        {
            if(haystack.substr(i-needle_size+1,needle_size)==needle)
            {
                return i-needle_size+1;
            }
        }
    }
    return -1;
}